

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O3

int ON_CompareKnotVector
              (int orderA,int cv_countA,double *knotA,int orderB,int cv_countB,double *knotB)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  if (orderA < orderB) {
    return -1;
  }
  if (orderB < orderA) {
    return 1;
  }
  if (cv_countB <= cv_countA) {
    if (cv_countB < cv_countA) {
      return 1;
    }
    if ((1 < orderA) && (knotA != (double *)0x0 && orderA <= cv_countA)) {
      uVar3 = (cv_countA + orderA) - 2;
      dVar7 = knotA[(ulong)(uint)orderA - 2];
      dVar1 = knotA[(ulong)(uint)cv_countA - 1];
      auVar8 = ZEXT816(0);
      if ((dVar7 != dVar1) || (NAN(dVar7) || NAN(dVar1))) {
        auVar8._8_8_ = (ABS(dVar7 - dVar1) + ABS(dVar1) + ABS(dVar7)) * 1.490116119385e-08;
        auVar8._0_8_ = (ABS(dVar7 - dVar1) + ABS(dVar1) + ABS(dVar7)) * 1.490116119385e-08;
        auVar8 = maxpd(_DAT_006be100,auVar8);
      }
      if ((int)uVar3 < 1) {
        return 0;
      }
      uVar4 = -(ulong)(auVar8._0_8_ <= auVar8._8_8_);
      dVar7 = (double)(~uVar4 & (ulong)auVar8._8_8_ | (ulong)auVar8._0_8_ & uVar4);
      uVar4 = 0;
      do {
        dVar1 = knotA[uVar4];
        dVar2 = knotB[uVar4];
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          if (dVar1 < dVar2 - dVar7) {
            return -1;
          }
          if (dVar2 < dVar1 - dVar7) {
            return 1;
          }
          dVar5 = ON_KnotTolerance(orderA,cv_countA,knotA,(int)uVar4);
          dVar6 = ON_KnotTolerance(orderB,cv_countB,knotB,(int)uVar4);
          dVar5 = (double)(~-(ulong)(dVar5 <= dVar6) & (ulong)dVar6 |
                          (ulong)dVar5 & -(ulong)(dVar5 <= dVar6));
          if (dVar1 < dVar2 - dVar5) {
            return -1;
          }
          if (dVar2 < dVar1 - dVar5) {
            return 1;
          }
        }
        uVar4 = uVar4 + 1;
        if (uVar3 == uVar4) {
          return 0;
        }
      } while( true );
    }
  }
  return -1;
}

Assistant:

int ON_CompareKnotVector( // returns 
                                      // -1: first < second
                                      //  0: first == second
                                      // +1: first > second
          int orderA,
          int cv_countA,
          const double* knotA,
          int orderB,
          int cv_countB,
          const double* knotB
          )
{
  const int knot_count = ON_KnotCount(orderA,cv_countA);
  int i;
  double a, b, atol, btol, ktol, tol;
  if ( orderA < orderB )
    return -1;
  if ( orderA > orderB )
    return 1;
  if ( cv_countA < cv_countB )
    return -1;
  if ( cv_countA > cv_countB )
    return 1;

  if ( !ON_GetKnotVectorDomain( orderA, cv_countA, knotA, &a, &b ) )
    return -1;
  atol = ON_DomainTolerance( a, b );
  if ( !ON_GetKnotVectorDomain( orderA, cv_countA, knotA, &a, &b ) )
    return 1;
  btol = ON_DomainTolerance( a, b );
  tol = (atol <= btol) ? atol : btol;

  for ( i = 0; i < knot_count; i++ ) {
    a = knotA[i];
    b = knotB[i];
    if ( a == b )
      continue;
    if ( a < b-tol )
      return -1;
    if ( b < a-tol )
      return 1;
    atol = ON_KnotTolerance( orderA, cv_countA, knotA, i );
    btol = ON_KnotTolerance( orderB, cv_countB, knotB, i );
    ktol = (atol <= btol) ? atol : btol;
    if ( a < b-ktol )
      return -1;
    if ( b < a-ktol )
      return 1;
  }
  return 0;
}